

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  u8 uVar1;
  undefined2 uVar2;
  VtabCtx *pVVar3;
  long lVar4;
  int iVar5;
  Index *pIVar6;
  char *pcVar7;
  Index *pIdx;
  Table *pNew;
  undefined1 local_1d8 [4];
  int initBusy;
  Parse sParse;
  Table *pTab;
  int rc;
  VtabCtx *pCtx;
  char *zCreateTable_local;
  sqlite3 *db_local;
  
  pTab._4_4_ = 0;
  sqlite3_mutex_enter(db->mutex);
  pVVar3 = db->pVtabCtx;
  if ((pVVar3 == (VtabCtx *)0x0) || (pVVar3->bDeclared != 0)) {
    sqlite3Error(db,0x15);
    sqlite3_mutex_leave(db->mutex);
    db_local._4_4_ = sqlite3MisuseError(0x24906);
  }
  else {
    sParse.pRename = (RenameToken *)pVVar3->pTab;
    sqlite3ParseObjectInit((Parse *)local_1d8,db);
    sParse.sLastToken._12_1_ = 1;
    sParse.oldmask._3_1_ = 1;
    uVar1 = (db->init).busy;
    (db->init).busy = '\0';
    sParse.u1.addrCrTab = 1;
    iVar5 = sqlite3RunParser((Parse *)local_1d8,zCreateTable);
    pcVar7 = sParse.zTail;
    if ((((iVar5 == 0) && (sParse.zTail != (char *)0x0)) && (db->mallocFailed == '\0')) &&
       (sParse.zTail[0x3f] == '\0')) {
      if (((sParse.pRename)->t).z == (char *)0x0) {
        ((sParse.pRename)->t).z = *(char **)(sParse.zTail + 8);
        sqlite3ExprListDelete(db,*(ExprList **)(sParse.zTail + 0x50));
        uVar2 = *(undefined2 *)(pcVar7 + 0x36);
        *(undefined2 *)&sParse.pRename[1].t.field_0xe = uVar2;
        *(undefined2 *)&sParse.pRename[1].pNext = uVar2;
        sParse.pRename[1].t.n = *(uint *)(pcVar7 + 0x30) & 0x280 | sParse.pRename[1].t.n;
        pcVar7[0x36] = '\0';
        pcVar7[0x37] = '\0';
        pcVar7[8] = '\0';
        pcVar7[9] = '\0';
        pcVar7[10] = '\0';
        pcVar7[0xb] = '\0';
        pcVar7[0xc] = '\0';
        pcVar7[0xd] = '\0';
        pcVar7[0xe] = '\0';
        pcVar7[0xf] = '\0';
        if ((((*(uint *)(pcVar7 + 0x30) & 0x80) != 0) &&
            (pVVar3->pVTable->pMod->pModule->xUpdate !=
             (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)) &&
           (pIVar6 = sqlite3PrimaryKeyIndex((Table *)pcVar7), pIVar6->nKeyCol != 1)) {
          pTab._4_4_ = 1;
        }
        lVar4 = *(long *)(pcVar7 + 0x10);
        if (lVar4 != 0) {
          *(long *)&((sParse.pRename)->t).n = lVar4;
          pcVar7[0x10] = '\0';
          pcVar7[0x11] = '\0';
          pcVar7[0x12] = '\0';
          pcVar7[0x13] = '\0';
          pcVar7[0x14] = '\0';
          pcVar7[0x15] = '\0';
          pcVar7[0x16] = '\0';
          pcVar7[0x17] = '\0';
          *(RenameToken **)(lVar4 + 0x18) = sParse.pRename;
        }
      }
      pVVar3->bDeclared = 1;
    }
    else {
      pcVar7 = (char *)0x0;
      if (sParse.db != (sqlite3 *)0x0) {
        pcVar7 = "%s";
      }
      sqlite3ErrorWithMsg(db,1,pcVar7,sParse.db);
      sqlite3DbFree(db,sParse.db);
      pTab._4_4_ = 1;
    }
    sParse.sLastToken._12_1_ = 0;
    if (sParse.zErrMsg != (char *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)sParse.zErrMsg);
    }
    sqlite3DeleteTable(db,(Table *)sParse.zTail);
    sqlite3ParseObjectReset((Parse *)local_1d8);
    (db->init).busy = uVar1;
    db_local._4_4_ = sqlite3ApiExit(db,pTab._4_4_);
    sqlite3_mutex_leave(db->mutex);
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  Parse sParse;
  int initBusy;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  sqlite3ParseObjectInit(&sParse, db);
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.disableTriggers = 1;
  /* We should never be able to reach this point while loading the
  ** schema.  Nevertheless, defend against that (turn off db->init.busy)
  ** in case a bug arises. */
  assert( db->init.busy==0 );
  initBusy = db->init.busy;
  db->init.busy = 0;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable)
   && ALWAYS(sParse.pNewTable!=0)
   && ALWAYS(!db->mallocFailed)
   && IsOrdinaryTable(sParse.pNewTable)
  ){
    assert( sParse.zErrMsg==0 );
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      sqlite3ExprListDelete(db, pNew->u.tab.pDfltList);
      pTab->nNVCol = pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR,
          (sParse.zErrMsg ? "%s" : 0), sParse.zErrMsg);
    sqlite3DbFree(db, sParse.zErrMsg);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParseObjectReset(&sParse);
  db->init.busy = initBusy;

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}